

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

void __thiscall Clasp::Asp::PrgAtom::removeDep(PrgAtom *this,Var bodyId,bool pos)

{
  pointer pLVar1;
  Literal *__dest;
  uint uVar2;
  Literal *pLVar3;
  size_t __n;
  
  pLVar1 = (this->deps_).ebo_.buf;
  __dest = std::__find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_equals_val<Clasp::Literal_const>>
                     (pLVar1,pLVar1 + (this->deps_).ebo_.size);
  uVar2 = (this->deps_).ebo_.size;
  pLVar3 = (this->deps_).ebo_.buf + uVar2;
  if (__dest != pLVar3) {
    __n = (long)pLVar3 - (long)(__dest + 1);
    if (0 < (long)__n) {
      memmove(__dest,__dest + 1,__n);
      uVar2 = (this->deps_).ebo_.size;
    }
    (this->deps_).ebo_.size = uVar2 - 1;
  }
  return;
}

Assistant:

void PrgAtom::removeDep(Var bodyId, bool pos) {
	LitVec::iterator it = std::find(deps_.begin(), deps_.end(), Literal(bodyId, !pos));
	if (it != deps_.end()) { deps_.erase(it); }
}